

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satelite.cpp
# Opt level: O1

bool __thiscall Clasp::SatElite::backwardSubsume(SatElite *this)

{
  undefined1 *puVar1;
  uint uVar2;
  pointer ppCVar3;
  pointer puVar4;
  Clause *pCVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  Clause *other;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  size_type sVar11;
  time_t tVar12;
  uint32 uVar13;
  uint uVar14;
  Literal LVar15;
  ulong uVar16;
  ulong uVar17;
  OccurList *pOVar18;
  long lVar19;
  uint clauseId;
  uint v;
  uint local_7c;
  Event local_48 [2];
  SatElite *local_40;
  uint32 local_38;
  uint local_34;
  char *__filename;
  
  bVar8 = propagateFacts(this);
  if (bVar8) {
    uVar10 = this->qFront_;
    if (uVar10 != (this->queue_).ebo_.size) {
      do {
        if ((uVar10 & 0x1fff) == 0) {
          tVar12 = time((time_t *)0x0);
          if (this->timeout_ < tVar12) break;
          uVar10 = (this->queue_).ebo_.size;
          if (1000 < uVar10) {
            local_38 = this->qFront_;
            local_48[0] = (Event)((Event_t<Clasp::SatElite::Progress>::id_s & 0xffff) * 0x1000 +
                                  ((uint)local_48[0] & 0xf0000000) + 0x53a);
            local_40 = this;
            local_34 = uVar10;
            SharedContext::report((this->super_SatPreprocessor).ctx_,local_48);
          }
        }
        uVar10 = this->qFront_;
        ppCVar3 = (this->super_SatPreprocessor).clauses_.ebo_.buf;
        puVar4 = (this->queue_).ebo_.buf;
        pCVar5 = ppCVar3[puVar4[uVar10]];
        this->qFront_ = uVar10 + 1;
        if (pCVar5 != (Clause *)0x0) {
          pCVar5 = ppCVar3[puVar4[uVar10]];
          if (pCVar5 != (Clause *)0x0) {
            pCVar5->field_0xb = pCVar5->field_0xb & 0xbf;
          }
          uVar13 = pCVar5->lits_[0].rep_;
          uVar10 = *(uint *)&pCVar5->field_0x8 & 0x3fffffff;
          if (1 < uVar10) {
            lVar19 = 0;
            do {
              uVar14 = pCVar5[1].lits_[lVar19 + -3].rep_;
              uVar6 = *(undefined8 *)&this->occurs_[uVar14 >> 2].field_0x18;
              uVar7 = *(undefined8 *)&this->occurs_[uVar13 >> 2].field_0x18;
              if (((uint)((ulong)uVar7 >> 0x20) & 0x3fffffff) + ((uint)uVar7 & 0x3fffffff) <=
                  ((uint)((ulong)uVar6 >> 0x20) & 0x3fffffff) + ((uint)uVar6 & 0x3fffffff)) {
                uVar14 = uVar13;
              }
              uVar13 = uVar14;
              lVar19 = lVar19 + 1;
            } while ((ulong)uVar10 - 1 != lVar19);
          }
          uVar14 = uVar13 >> 2;
          uVar10 = this->occurs_[uVar14].refs.super_type.
                   super_left_right_rep<Clasp::Literal,_unsigned_int>.left_;
          pOVar18 = this->occurs_ + uVar14;
          sVar11 = 0;
          bVar8 = uVar10 < 4;
          if (!bVar8) {
            uVar17 = 0;
            local_7c = 0;
            do {
              uVar2 = *(uint *)((pOVar18->refs).super_type.
                                super_left_right_rep<Clasp::Literal,_unsigned_int>.buf_ + uVar17 * 4
                               );
              clauseId = uVar2 >> 2;
              __filename = (char *)(ulong)clauseId;
              other = (this->super_SatPreprocessor).clauses_.ebo_.buf[(long)__filename];
              if ((other == (Clause *)0x0) || (other == pCVar5)) {
                if (other != (Clause *)0x0) goto LAB_00191552;
                bVar9 = true;
              }
              else {
                LVar15.rep_ = ((uVar13 ^ uVar2) & 2) >> 1;
                if (LVar15.rep_ != 0) {
                  LVar15.rep_ = uVar13;
                }
                LVar15 = subsumes(this,pCVar5,other,LVar15);
                if ((LVar15.rep_ ^ 2) < 2) {
LAB_00191552:
                  uVar16 = (ulong)local_7c;
                  local_7c = local_7c + 1;
                  bVar9 = true;
                  if (uVar17 != uVar16) {
                    *(uint *)((pOVar18->refs).super_type.
                              super_left_right_rep<Clasp::Literal,_unsigned_int>.buf_ + uVar16 * 4)
                         = uVar2;
                  }
                }
                else if (LVar15.rep_ < 2) {
                  detach(this,clauseId);
                  bVar9 = true;
                }
                else {
                  v = LVar15.rep_ >> 2;
                  OccurList::remove(this->occurs_ + v,__filename);
                  updateHeap(this,v);
                  bVar9 = strengthenClause(this,clauseId,(Literal)(LVar15.rep_ & 0xfffffffe ^ 2));
                  if (bVar9) {
                    bVar9 = true;
                    if ((v != uVar14) &&
                       ((this->super_SatPreprocessor).clauses_.ebo_.buf[(long)__filename] !=
                        (Clause *)0x0)) goto LAB_00191552;
                  }
                  else {
                    bVar9 = false;
                  }
                }
              }
              if (!bVar9) break;
              uVar17 = uVar17 + 1;
              bVar8 = uVar10 >> 2 == uVar17;
            } while (!bVar8);
            sVar11 = local_7c << 2;
          }
          if (!bVar8) goto LAB_00191697;
          (pOVar18->refs).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.left_ =
               sVar11;
          puVar1 = &this->occurs_[uVar14].field_0x18;
          *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffffffff7fffffff;
          bVar8 = propagateFacts(this);
          if (!bVar8) goto LAB_00191697;
        }
        uVar10 = this->qFront_;
      } while (uVar10 != (this->queue_).ebo_.size);
    }
    (this->queue_).ebo_.size = 0;
    this->qFront_ = 0;
    bVar8 = true;
  }
  else {
LAB_00191697:
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool SatElite::backwardSubsume() {
	if (!propagateFacts()) return false;
	while (qFront_ != queue_.size()) {
		if ((qFront_ & 8191) == 0) {
			if (timeout()) break;
			if (queue_.size() > 1000) reportProgress(Progress::event_subsumption, qFront_, queue_.size());
		}
		if (peekSubQueue() == 0) { ++qFront_; continue; }
		Clause& c = *popSubQueue();
		// Try to minimize effort by testing against the var in c that occurs least often;
		Literal best = c[0];
		for (uint32 i = 1; i < c.size(); ++i) {
			if (occurs_[c[i].var()].numOcc() < occurs_[best.var()].numOcc()) {
				best  = c[i];
			}
		}
		// Test against all clauses containing best
		ClWList& cls = occurs_[best.var()].refs;
		Literal res  = lit_false();
		uint32  j    = 0;
		// must use index access because cls might change!
		for (uint32 i = 0, end = cls.left_size(); i != end; ++i) {
			Literal cl     = cls.left(i);
			uint32 otherId = cl.var();
			Clause* other  = clause(otherId);
			if (other && other!= &c && (res = subsumes(c, *other, best.sign()==cl.sign()?lit_true():best)) != lit_false()) {
				if (res == lit_true()) {
					// other is subsumed - remove it
					detach(otherId);
					other = 0;
				}
				else {
					// self-subsumption resolution; other is subsumed by c\{res} U {~res}
					// remove ~res from other, add it to subQ so that we can check if it now subsumes c
					res = ~res;
					occurs_[res.var()].remove(otherId, res.sign(), res.var() != best.var());
					updateHeap(res.var());
					if (!strengthenClause(otherId, res))              { return false; }
					if (res.var() == best.var() || !clause(otherId))  { other = 0; }
				}
			}
			if (other && j++ != i)  { cls.left(j-1) = cl; }
		}
		cls.shrink_left(cls.left_begin()+j);
		occurs_[best.var()].dirty = 0;
		assert(occurs_[best.var()].numOcc() == (uint32)cls.left_size());
		if (!propagateFacts()) return false;
	}
	queue_.clear();
	qFront_ = 0;
	return true;
}